

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_diag_sse41_128_16.c
# Opt level: O0

parasail_result_t *
parasail_nw_table_diag_sse41_128_16
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  undefined2 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int *piVar10;
  int *piVar11;
  int *piVar12;
  int *piVar13;
  int *piVar14;
  int *piVar15;
  int *piVar16;
  int *piVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  short sVar43;
  short sVar44;
  short sVar45;
  int16_t *ptr;
  int16_t *ptr_00;
  int16_t *ptr_01;
  int16_t *piVar46;
  int32_t j_00;
  ushort uVar47;
  ushort uVar48;
  ushort uVar52;
  ushort uVar53;
  short sVar54;
  ushort uVar55;
  ushort uVar56;
  short sVar57;
  ushort uVar58;
  ushort uVar59;
  short sVar60;
  ushort uVar61;
  ushort uVar62;
  short sVar63;
  ushort uVar65;
  ushort uVar68;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  ushort uVar66;
  short sVar67;
  ushort uVar69;
  short sVar70;
  ushort uVar71;
  ushort uVar72;
  short sVar73;
  ulong uVar64;
  undefined1 auVar74 [16];
  __m128i vWH_00;
  int local_990;
  int local_98c;
  int local_978;
  int local_974;
  int local_960;
  int local_95c;
  int local_948;
  int local_944;
  int local_930;
  int local_92c;
  int local_918;
  int local_914;
  int local_900;
  int local_8fc;
  int local_8e8;
  int local_8e4;
  int local_8b0;
  int16_t value;
  __m128i cond_all;
  __m128i cond_valid_J;
  __m128i cond_valid_I;
  __m128i cond;
  __m128i vNWH;
  __m128i vMat;
  int *matrow7;
  int *matrow6;
  int *matrow5;
  int *matrow4;
  int *matrow3;
  int *matrow2;
  int *matrow1;
  int *matrow0;
  __m128i vJ;
  __m128i vF;
  __m128i vE;
  __m128i vWH;
  __m128i vNH;
  __m128i vIBoundary;
  __m128i vJLimit1;
  __m128i vJLimit;
  __m128i vILimit1;
  __m128i vILimit;
  __m128i vMax;
  __m128i vJreset;
  __m128i vI;
  __m128i vNegOne;
  __m128i vGapN;
  __m128i vN;
  __m128i vOne;
  __m128i vGap;
  __m128i vOpen;
  __m128i vNegInf;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  short local_67e;
  int iStack_678;
  int16_t score;
  int16_t POS_LIMIT;
  int16_t NEG_LIMIT;
  int32_t end_ref;
  int32_t end_query;
  int32_t j;
  int32_t i;
  parasail_result_t *result;
  int16_t *F_pr;
  int16_t *H_pr;
  int16_t *s2;
  int16_t *_F_pr;
  int16_t *_H_pr;
  int16_t *s2B;
  int16_t *s1;
  int32_t s2Len_PAD;
  int32_t s1Len_PAD;
  int32_t s1Len;
  int32_t PAD2;
  int32_t PAD;
  int32_t N;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *_s2_local;
  int _s1Len_local;
  char *_s1_local;
  short local_2f8;
  short sStack_2f6;
  short sStack_2f4;
  short sStack_2f2;
  short sStack_2f0;
  short sStack_2ee;
  short sStack_2ec;
  short sStack_2ea;
  short local_2b8;
  short sStack_2b6;
  short sStack_2b4;
  short sStack_2b2;
  short sStack_2b0;
  short sStack_2ae;
  short sStack_2ac;
  short sStack_2aa;
  short local_2a8;
  short sStack_2a6;
  short sStack_2a4;
  short sStack_2a2;
  short sStack_2a0;
  short sStack_29e;
  short sStack_29c;
  short sStack_29a;
  short local_298;
  short sStack_296;
  short sStack_294;
  short sStack_292;
  short sStack_290;
  short sStack_28e;
  short sStack_28c;
  short sStack_28a;
  short local_288;
  short sStack_286;
  short sStack_284;
  short sStack_282;
  short sStack_280;
  short sStack_27e;
  short sStack_27c;
  short sStack_27a;
  short local_278;
  short sStack_276;
  short sStack_274;
  short sStack_272;
  short sStack_270;
  short sStack_26e;
  short sStack_26c;
  short sStack_26a;
  short local_208;
  short sStack_206;
  short sStack_204;
  short sStack_202;
  short sStack_200;
  short sStack_1fe;
  short sStack_1fc;
  short sStack_1fa;
  short local_1e8;
  short sStack_1e6;
  short sStack_1e4;
  short sStack_1e2;
  short sStack_1e0;
  short sStack_1de;
  short sStack_1dc;
  short sStack_1da;
  short local_1d8;
  short sStack_1d6;
  short sStack_1d4;
  short sStack_1d2;
  short sStack_1d0;
  short sStack_1ce;
  short sStack_1cc;
  short sStack_1ca;
  short local_1b8;
  short sStack_1b6;
  short sStack_1b4;
  short sStack_1b2;
  short sStack_1b0;
  short sStack_1ae;
  short sStack_1ac;
  short sStack_1aa;
  short sStack_e6;
  short sStack_e4;
  short sStack_e2;
  short sStack_e0;
  short sStack_de;
  short sStack_dc;
  short sStack_da;
  short local_d8;
  short sStack_d6;
  short sStack_d4;
  short sStack_d2;
  short sStack_d0;
  short sStack_ce;
  short sStack_cc;
  short sStack_ca;
  short local_58;
  short sStack_56;
  short sStack_54;
  short sStack_52;
  short sStack_50;
  short sStack_4e;
  short sStack_4c;
  short sStack_4a;
  short local_28;
  short sStack_26;
  short sStack_24;
  short sStack_22;
  short sStack_20;
  short sStack_1e;
  short sStack_1c;
  short sStack_1a;
  
  s2B = (int16_t *)0x0;
  if (_s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_table_diag_sse41_128_16","_s2");
    _s1_local = (char *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_table_diag_sse41_128_16","s2Len");
    _s1_local = (char *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_table_diag_sse41_128_16","open");
    _s1_local = (char *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_table_diag_sse41_128_16","gap");
    _s1_local = (char *)0x0;
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_table_diag_sse41_128_16","matrix");
    _s1_local = (char *)0x0;
  }
  else {
    if (matrix->type == 0) {
      if (_s1 == (char *)0x0) {
        fprintf(_stderr,"%s: missing %s\n","parasail_nw_table_diag_sse41_128_16","_s1");
        return (parasail_result_t *)0x0;
      }
      if (_s1Len < 1) {
        fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_table_diag_sse41_128_16","_s1Len");
        return (parasail_result_t *)0x0;
      }
    }
    local_8b0 = _s1Len;
    if (matrix->type != 0) {
      local_8b0 = matrix->length;
    }
    _POS_LIMIT = local_8b0 + -1;
    iStack_678 = s2Len + -1;
    N._0_2_ = (short)open;
    sVar43 = (short)N;
    if (matrix->min <= -open) {
      sVar43 = -(short)matrix->min;
    }
    sVar43 = sVar43 + -0x7fff;
    sVar44 = ((ushort)matrix->max ^ 0x7fff) - 1;
    vNegInf[1] = CONCAT26(sVar43,CONCAT24(sVar43,CONCAT22(sVar43,sVar43)));
    vSaturationCheckMax[0] = CONCAT26(sVar43,CONCAT24(sVar43,CONCAT22(sVar43,sVar43)));
    vSaturationCheckMax[1] = CONCAT26(sVar44,CONCAT24(sVar44,CONCAT22(sVar44,sVar44)));
    vSaturationCheckMin[0] = CONCAT26(sVar44,CONCAT24(sVar44,CONCAT22(sVar44,sVar44)));
    uVar18 = CONCAT26(sVar43,CONCAT24(sVar43,CONCAT22(sVar43,sVar43)));
    uVar64 = CONCAT26(sVar43,CONCAT24(sVar43,CONCAT22(sVar43,sVar43)));
    uVar19 = CONCAT26((short)N,CONCAT24((short)N,CONCAT22((short)N,(short)N)));
    uVar21 = CONCAT26((short)N,CONCAT24((short)N,CONCAT22((short)N,(short)N)));
    PAD._0_2_ = (short)gap;
    uVar20 = CONCAT26((short)PAD,CONCAT24((short)PAD,CONCAT22((short)PAD,(short)PAD)));
    uVar22 = CONCAT26((short)PAD,CONCAT24((short)PAD,CONCAT22((short)PAD,(short)PAD)));
    sVar45 = (short)PAD * 8;
    auVar23._2_2_ = sVar45;
    auVar23._0_2_ = sVar45;
    auVar23._4_2_ = sVar45;
    auVar23._6_2_ = sVar45;
    auVar23._10_2_ = sVar45;
    auVar23._8_2_ = sVar45;
    auVar23._12_2_ = sVar45;
    auVar23._14_2_ = sVar45;
    vI[0]._0_6_ = 0x100020003;
    vJreset[1] = 0x4000500060007;
    vI[0]._6_2_ = 0;
    vMax[0] = uVar64;
    vILimit[1] = uVar18;
    s2Len_PAD._0_2_ = (undefined2)local_8b0;
    auVar29._2_2_ = (undefined2)s2Len_PAD;
    auVar29._0_2_ = (undefined2)s2Len_PAD;
    auVar29._4_2_ = (undefined2)s2Len_PAD;
    auVar29._6_2_ = (undefined2)s2Len_PAD;
    auVar29._10_2_ = (undefined2)s2Len_PAD;
    auVar29._8_2_ = (undefined2)s2Len_PAD;
    auVar29._12_2_ = (undefined2)s2Len_PAD;
    auVar29._14_2_ = (undefined2)s2Len_PAD;
    auVar49._8_8_ = 0x1000100010001;
    auVar49._0_8_ = 0x1000100010001;
    auVar49 = psubsw(auVar29,auVar49);
    gap_local._0_2_ = (undefined2)s2Len;
    auVar51._2_2_ = (undefined2)gap_local;
    auVar51._0_2_ = (undefined2)gap_local;
    auVar51._4_2_ = (undefined2)gap_local;
    auVar51._6_2_ = (undefined2)gap_local;
    auVar51._10_2_ = (undefined2)gap_local;
    auVar51._8_2_ = (undefined2)gap_local;
    auVar51._12_2_ = (undefined2)gap_local;
    auVar51._14_2_ = (undefined2)gap_local;
    auVar50._8_8_ = 0x1000100010001;
    auVar50._0_8_ = 0x1000100010001;
    auVar50 = psubsw(auVar51,auVar50);
    vIBoundary[0]._6_2_ = -(short)N;
    j_00 = CONCAT22((short)((uint)gap >> 0x10),vIBoundary[0]._6_2_ - (short)PAD);
    vNH[1]._2_2_ = vIBoundary[0]._6_2_ + (short)PAD * -6;
    vNH[1]._0_2_ = ((short)PAD - (short)(gap << 3)) - (short)N;
    vNH[1]._4_2_ = vIBoundary[0]._6_2_ + (short)PAD * -5;
    vNH[1]._6_2_ = vIBoundary[0]._6_2_ - (short)(gap << 2);
    vIBoundary[0]._2_2_ = vIBoundary[0]._6_2_ + (short)PAD * -2;
    vIBoundary[0]._0_2_ = vIBoundary[0]._6_2_ + (short)PAD * -3;
    vIBoundary[0]._4_2_ = vIBoundary[0]._6_2_ - (short)PAD;
    _s1_local = (char *)parasail_result_new_table1(local_8b0,s2Len);
    if ((parasail_result_t *)_s1_local == (parasail_result_t *)0x0) {
      _s1_local = (char *)0x0;
    }
    else {
      ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x8201001;
      ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x20000;
      ptr = parasail_memalign_int16_t(0x10,(long)(s2Len + 0xe));
      ptr_00 = parasail_memalign_int16_t(0x10,(long)(s2Len + 0xe));
      ptr_01 = parasail_memalign_int16_t(0x10,(long)(s2Len + 0xe));
      piVar46 = ptr + 7;
      if (ptr == (int16_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_00 == (int16_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_01 == (int16_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else {
        if (matrix->type == 0) {
          s2B = parasail_memalign_int16_t(0x10,(long)(local_8b0 + 7));
          if (s2B == (int16_t *)0x0) {
            return (parasail_result_t *)0x0;
          }
          for (end_query = 0; end_query < local_8b0; end_query = end_query + 1) {
            s2B[end_query] = (int16_t)matrix->mapper[(byte)_s1[end_query]];
          }
          for (end_query = local_8b0; end_query < local_8b0 + 7; end_query = end_query + 1) {
            s2B[end_query] = 0;
          }
        }
        for (end_ref = 0; end_ref < s2Len; end_ref = end_ref + 1) {
          piVar46[end_ref] = (int16_t)matrix->mapper[(byte)_s2[end_ref]];
        }
        for (end_ref = -7; iVar2 = s2Len, end_ref < 0; end_ref = end_ref + 1) {
          piVar46[end_ref] = 0;
        }
        while (end_ref = iVar2, end_ref < s2Len + 7) {
          piVar46[end_ref] = 0;
          iVar2 = end_ref + 1;
        }
        for (end_ref = 0; end_ref < s2Len; end_ref = end_ref + 1) {
          ptr_00[(long)end_ref + 7] = -((short)end_ref * (short)PAD) - (short)N;
          ptr_01[(long)end_ref + 7] = sVar43;
        }
        for (end_ref = -7; iVar2 = s2Len, end_ref < 0; end_ref = end_ref + 1) {
          ptr_00[(long)end_ref + 7] = sVar43;
          ptr_01[(long)end_ref + 7] = sVar43;
        }
        while (end_ref = iVar2, end_ref < s2Len + 7) {
          ptr_00[(long)end_ref + 7] = sVar43;
          ptr_01[(long)end_ref + 7] = sVar43;
          iVar2 = end_ref + 1;
        }
        ptr_00[6] = 0;
        for (end_query = 0; end_query < local_8b0; end_query = end_query + 8) {
          vNH[0] = uVar64;
          vWH[1] = uVar18;
          vWH[0] = uVar64;
          vE[1] = uVar18;
          vE[0] = uVar64;
          vF[1] = uVar18;
          vF[0] = uVar64;
          vJ[1] = uVar18;
          vJ[0]._0_6_ = 0xfffffffefffd;
          matrow0 = (int *)0xfffcfffbfffafff9;
          vJ[0]._6_2_ = 0;
          piVar10 = matrix->matrix;
          iVar2 = matrix->size;
          if (matrix->type == 0) {
            local_8e4 = (int)s2B[end_query];
          }
          else {
            if (end_query < local_8b0) {
              local_8e8 = end_query;
            }
            else {
              local_8e8 = local_8b0 + -1;
            }
            local_8e4 = local_8e8;
          }
          piVar11 = matrix->matrix;
          iVar3 = matrix->size;
          if (matrix->type == 0) {
            local_8fc = (int)s2B[end_query + 1];
          }
          else {
            if (end_query + 1 < local_8b0) {
              local_900 = end_query + 1;
            }
            else {
              local_900 = local_8b0 + -1;
            }
            local_8fc = local_900;
          }
          piVar12 = matrix->matrix;
          iVar4 = matrix->size;
          if (matrix->type == 0) {
            local_914 = (int)s2B[end_query + 2];
          }
          else {
            if (end_query + 2 < local_8b0) {
              local_918 = end_query + 2;
            }
            else {
              local_918 = local_8b0 + -1;
            }
            local_914 = local_918;
          }
          piVar13 = matrix->matrix;
          iVar5 = matrix->size;
          if (matrix->type == 0) {
            local_92c = (int)s2B[end_query + 3];
          }
          else {
            if (end_query + 3 < local_8b0) {
              local_930 = end_query + 3;
            }
            else {
              local_930 = local_8b0 + -1;
            }
            local_92c = local_930;
          }
          piVar14 = matrix->matrix;
          iVar6 = matrix->size;
          if (matrix->type == 0) {
            local_944 = (int)s2B[end_query + 4];
          }
          else {
            if (end_query + 4 < local_8b0) {
              local_948 = end_query + 4;
            }
            else {
              local_948 = local_8b0 + -1;
            }
            local_944 = local_948;
          }
          piVar15 = matrix->matrix;
          iVar7 = matrix->size;
          if (matrix->type == 0) {
            local_95c = (int)s2B[end_query + 5];
          }
          else {
            if (end_query + 5 < local_8b0) {
              local_960 = end_query + 5;
            }
            else {
              local_960 = local_8b0 + -1;
            }
            local_95c = local_960;
          }
          piVar16 = matrix->matrix;
          iVar8 = matrix->size;
          if (matrix->type == 0) {
            local_974 = (int)s2B[end_query + 6];
          }
          else {
            if (end_query + 6 < local_8b0) {
              local_978 = end_query + 6;
            }
            else {
              local_978 = local_8b0 + -1;
            }
            local_974 = local_978;
          }
          piVar17 = matrix->matrix;
          iVar9 = matrix->size;
          if (matrix->type == 0) {
            local_98c = (int)s2B[end_query + 7];
          }
          else {
            if (end_query + 7 < local_8b0) {
              local_990 = end_query + 7;
            }
            else {
              local_990 = local_8b0 + -1;
            }
            local_98c = local_990;
          }
          vWH[1] = vWH._10_8_;
          vNH[0] = uVar64 >> 0x10;
          vNH[0] = vNH[0] | (ulong)(ushort)ptr_00[6] << 0x30;
          vE[1] = vE._10_8_;
          vWH[0] = uVar64 >> 0x10;
          vWH[0] = vWH[0] | (ulong)(ushort)-((short)N + (short)end_query * (short)PAD) << 0x30;
          ptr_00[6] = -(((short)end_query + 8) * (short)PAD) - (short)N;
          for (end_ref = 0; auVar29 = stack0xfffffffffffff838, auVar51 = stack0xfffffffffffff808,
              end_ref < s2Len + 7; end_ref = end_ref + 1) {
            stack0xfffffffffffff838 = vE._10_14_;
            vNH[0]._6_2_ = ptr_00[(long)end_ref + 7];
            auVar30 = stack0xfffffffffffff838;
            stack0xfffffffffffff808 = vJ._10_14_;
            vF[0]._6_2_ = ptr_01[(long)end_ref + 7];
            auVar24 = stack0xfffffffffffff808;
            vWH[1] = vE._10_8_;
            vNH[0] = auVar30._8_8_;
            auVar28._8_8_ = vNH[0];
            auVar28._0_8_ = vWH[1];
            auVar27._8_8_ = uVar21;
            auVar27._0_8_ = uVar19;
            auVar74 = psubsw(auVar28,auVar27);
            vJ[1] = auVar51._2_8_;
            vF[0] = auVar24._8_8_;
            auVar26._8_8_ = vF[0];
            auVar26._0_8_ = vJ[1];
            auVar25._8_8_ = uVar22;
            auVar25._0_8_ = uVar20;
            auVar51 = psubsw(auVar26,auVar25);
            local_278 = auVar74._0_2_;
            sStack_276 = auVar74._2_2_;
            sStack_274 = auVar74._4_2_;
            sStack_272 = auVar74._6_2_;
            sStack_270 = auVar74._8_2_;
            sStack_26e = auVar74._10_2_;
            sStack_26c = auVar74._12_2_;
            sStack_26a = auVar74._14_2_;
            local_288 = auVar51._0_2_;
            sStack_286 = auVar51._2_2_;
            sStack_284 = auVar51._4_2_;
            sStack_282 = auVar51._6_2_;
            sStack_280 = auVar51._8_2_;
            sStack_27e = auVar51._10_2_;
            sStack_27c = auVar51._12_2_;
            sStack_27a = auVar51._14_2_;
            uVar47 = (ushort)(local_278 < local_288) * local_288 |
                     (ushort)(local_278 >= local_288) * local_278;
            uVar52 = (ushort)(sStack_276 < sStack_286) * sStack_286 |
                     (ushort)(sStack_276 >= sStack_286) * sStack_276;
            uVar55 = (ushort)(sStack_274 < sStack_284) * sStack_284 |
                     (ushort)(sStack_274 >= sStack_284) * sStack_274;
            uVar58 = (ushort)(sStack_272 < sStack_282) * sStack_282 |
                     (ushort)(sStack_272 >= sStack_282) * sStack_272;
            uVar61 = (ushort)(sStack_270 < sStack_280) * sStack_280 |
                     (ushort)(sStack_270 >= sStack_280) * sStack_270;
            uVar65 = (ushort)(sStack_26e < sStack_27e) * sStack_27e |
                     (ushort)(sStack_26e >= sStack_27e) * sStack_26e;
            uVar68 = (ushort)(sStack_26c < sStack_27c) * sStack_27c |
                     (ushort)(sStack_26c >= sStack_27c) * sStack_26c;
            uVar71 = (ushort)(sStack_26a < sStack_27a) * sStack_27a |
                     (ushort)(sStack_26a >= sStack_27a) * sStack_26a;
            vJ[1] = CONCAT26(uVar58,CONCAT24(uVar55,CONCAT22(uVar52,uVar47)));
            vF[0]._0_2_ = uVar61;
            vF[0]._2_2_ = uVar65;
            vF[0]._4_2_ = uVar68;
            vF[0]._6_2_ = uVar71;
            auVar74._8_8_ = uVar21;
            auVar74._0_8_ = uVar19;
            auVar74 = psubsw(stack0xfffffffffffff828,auVar74);
            auVar24._8_8_ = uVar22;
            auVar24._0_8_ = uVar20;
            auVar51 = psubsw(stack0xfffffffffffff818,auVar24);
            local_298 = auVar74._0_2_;
            sStack_296 = auVar74._2_2_;
            sStack_294 = auVar74._4_2_;
            sStack_292 = auVar74._6_2_;
            sStack_290 = auVar74._8_2_;
            sStack_28e = auVar74._10_2_;
            sStack_28c = auVar74._12_2_;
            sStack_28a = auVar74._14_2_;
            local_2a8 = auVar51._0_2_;
            sStack_2a6 = auVar51._2_2_;
            sStack_2a4 = auVar51._4_2_;
            sStack_2a2 = auVar51._6_2_;
            sStack_2a0 = auVar51._8_2_;
            sStack_29e = auVar51._10_2_;
            sStack_29c = auVar51._12_2_;
            sStack_29a = auVar51._14_2_;
            uVar48 = (ushort)(local_298 < local_2a8) * local_2a8 |
                     (ushort)(local_298 >= local_2a8) * local_298;
            uVar53 = (ushort)(sStack_296 < sStack_2a6) * sStack_2a6 |
                     (ushort)(sStack_296 >= sStack_2a6) * sStack_296;
            uVar56 = (ushort)(sStack_294 < sStack_2a4) * sStack_2a4 |
                     (ushort)(sStack_294 >= sStack_2a4) * sStack_294;
            uVar59 = (ushort)(sStack_292 < sStack_2a2) * sStack_2a2 |
                     (ushort)(sStack_292 >= sStack_2a2) * sStack_292;
            uVar62 = (ushort)(sStack_290 < sStack_2a0) * sStack_2a0 |
                     (ushort)(sStack_290 >= sStack_2a0) * sStack_290;
            uVar66 = (ushort)(sStack_28e < sStack_29e) * sStack_29e |
                     (ushort)(sStack_28e >= sStack_29e) * sStack_28e;
            uVar69 = (ushort)(sStack_28c < sStack_29c) * sStack_29c |
                     (ushort)(sStack_28c >= sStack_29c) * sStack_28c;
            uVar72 = (ushort)(sStack_28a < sStack_29a) * sStack_29a |
                     (ushort)(sStack_28a >= sStack_29a) * sStack_28a;
            vF[1] = CONCAT26(uVar59,CONCAT24(uVar56,CONCAT22(uVar53,uVar48)));
            vE[0]._0_2_ = uVar62;
            vE[0]._2_2_ = uVar66;
            vE[0]._4_2_ = uVar69;
            vE[0]._6_2_ = uVar72;
            uVar1 = (undefined2)piVar11[(long)(iVar3 * local_8fc) + (long)piVar46[end_ref + -1]];
            j_00 = CONCAT22((short)((uint)j_00 >> 0x10),uVar1);
            auVar32._2_2_ = (short)piVar16[(long)(iVar8 * local_974) + (long)piVar46[end_ref + -6]];
            auVar32._0_2_ = (short)piVar17[(long)(iVar9 * local_98c) + (long)piVar46[end_ref + -7]];
            auVar32._4_2_ = (short)piVar15[(long)(iVar7 * local_95c) + (long)piVar46[end_ref + -5]];
            auVar32._6_2_ = (short)piVar14[(long)(iVar6 * local_944) + (long)piVar46[end_ref + -4]];
            auVar32._10_2_ = (short)piVar12[(long)(iVar4 * local_914) + (long)piVar46[end_ref + -2]]
            ;
            auVar32._8_2_ = (short)piVar13[(long)(iVar5 * local_92c) + (long)piVar46[end_ref + -3]];
            auVar32._12_2_ = uVar1;
            auVar32._14_2_ = (short)piVar10[(long)(iVar2 * local_8e4) + (long)piVar46[end_ref]];
            auVar51 = paddsw(auVar29,auVar32);
            local_2b8 = auVar51._0_2_;
            sStack_2b6 = auVar51._2_2_;
            sStack_2b4 = auVar51._4_2_;
            sStack_2b2 = auVar51._6_2_;
            sStack_2b0 = auVar51._8_2_;
            sStack_2ae = auVar51._10_2_;
            sStack_2ac = auVar51._12_2_;
            sStack_2aa = auVar51._14_2_;
            uVar48 = (local_2b8 < (short)uVar48) * uVar48 |
                     (ushort)(local_2b8 >= (short)uVar48) * local_2b8;
            uVar53 = (sStack_2b6 < (short)uVar53) * uVar53 |
                     (ushort)(sStack_2b6 >= (short)uVar53) * sStack_2b6;
            uVar56 = (sStack_2b4 < (short)uVar56) * uVar56 |
                     (ushort)(sStack_2b4 >= (short)uVar56) * sStack_2b4;
            uVar59 = (sStack_2b2 < (short)uVar59) * uVar59 |
                     (ushort)(sStack_2b2 >= (short)uVar59) * sStack_2b2;
            uVar62 = (sStack_2b0 < (short)uVar62) * uVar62 |
                     (ushort)(sStack_2b0 >= (short)uVar62) * sStack_2b0;
            uVar66 = (sStack_2ae < (short)uVar66) * uVar66 |
                     (ushort)(sStack_2ae >= (short)uVar66) * sStack_2ae;
            uVar69 = (sStack_2ac < (short)uVar69) * uVar69 |
                     (ushort)(sStack_2ac >= (short)uVar69) * sStack_2ac;
            uVar72 = (sStack_2aa < (short)uVar72) * uVar72 |
                     (ushort)(sStack_2aa >= (short)uVar72) * sStack_2aa;
            vE[1] = CONCAT26(((short)uVar59 < (short)uVar58) * uVar58 |
                             ((short)uVar59 >= (short)uVar58) * uVar59,
                             CONCAT24(((short)uVar56 < (short)uVar55) * uVar55 |
                                      ((short)uVar56 >= (short)uVar55) * uVar56,
                                      CONCAT22(((short)uVar53 < (short)uVar52) * uVar52 |
                                               ((short)uVar53 >= (short)uVar52) * uVar53,
                                               ((short)uVar48 < (short)uVar47) * uVar47 |
                                               ((short)uVar48 >= (short)uVar47) * uVar48)));
            vWH[0]._0_2_ = ((short)uVar62 < (short)uVar61) * uVar61 |
                           ((short)uVar62 >= (short)uVar61) * uVar62;
            vWH[0]._2_2_ = ((short)uVar66 < (short)uVar65) * uVar65 |
                           ((short)uVar66 >= (short)uVar65) * uVar66;
            vWH[0]._4_2_ = ((short)uVar69 < (short)uVar68) * uVar68 |
                           ((short)uVar69 >= (short)uVar68) * uVar69;
            vWH[0]._6_2_ = ((short)uVar72 < (short)uVar71) * uVar71 |
                           ((short)uVar72 >= (short)uVar71) * uVar72;
            local_1b8 = (short)matrow0;
            sStack_1b6 = matrow0._2_2_;
            sStack_1b4 = matrow0._4_2_;
            sStack_1b2 = matrow0._6_2_;
            sStack_1b0 = matrow0._8_2_;
            sStack_1ae = matrow0._10_2_;
            sStack_1ac = matrow0._12_2_;
            sStack_1aa = matrow0._14_2_;
            sVar45 = -(ushort)(local_1b8 == -1);
            sVar54 = -(ushort)(sStack_1b6 == -1);
            sVar57 = -(ushort)(sStack_1b4 == -1);
            sVar60 = -(ushort)(sStack_1b2 == -1);
            sVar63 = -(ushort)(sStack_1b0 == -1);
            sVar67 = -(ushort)(sStack_1ae == -1);
            sVar70 = -(ushort)(sStack_1ac == -1);
            sVar73 = -(ushort)(sStack_1aa == -1);
            auVar40._2_2_ = sVar54;
            auVar40._0_2_ = sVar45;
            auVar40._4_2_ = sVar57;
            auVar40._6_2_ = sVar60;
            auVar40._10_2_ = sVar67;
            auVar40._8_2_ = sVar63;
            auVar40._12_2_ = sVar70;
            auVar40._14_2_ = sVar73;
            auVar41._8_8_ = vWH[0];
            auVar41._0_8_ = vE[1];
            register0x00001240 = pblendvb(auVar41,stack0xfffffffffffff848,auVar40);
            auVar37._2_2_ = sVar54;
            auVar37._0_2_ = sVar45;
            auVar37._4_2_ = sVar57;
            auVar37._6_2_ = sVar60;
            auVar37._10_2_ = sVar67;
            auVar37._8_2_ = sVar63;
            auVar37._12_2_ = sVar70;
            auVar37._14_2_ = sVar73;
            auVar39._8_8_ = vF[0];
            auVar39._0_8_ = vJ[1];
            auVar38._8_8_ = uVar64;
            auVar38._0_8_ = uVar18;
            register0x00001240 = pblendvb(auVar39,auVar38,auVar37);
            auVar34._2_2_ = sVar54;
            auVar34._0_2_ = sVar45;
            auVar34._4_2_ = sVar57;
            auVar34._6_2_ = sVar60;
            auVar34._10_2_ = sVar67;
            auVar34._8_2_ = sVar63;
            auVar34._12_2_ = sVar70;
            auVar34._14_2_ = sVar73;
            auVar36._8_8_ = vE[0];
            auVar36._0_8_ = vF[1];
            auVar35._8_8_ = uVar64;
            auVar35._0_8_ = uVar18;
            register0x00001240 = pblendvb(auVar36,auVar35,auVar34);
            if (7 < end_ref) {
              local_d8 = (short)vSaturationCheckMax[1];
              sStack_d6 = (short)((ulong)vSaturationCheckMax[1] >> 0x10);
              sStack_d4 = (short)((ulong)vSaturationCheckMax[1] >> 0x20);
              sStack_d2 = (short)((ulong)vSaturationCheckMax[1] >> 0x30);
              sStack_d0 = (short)vSaturationCheckMin[0];
              sStack_ce = (short)((ulong)vSaturationCheckMin[0] >> 0x10);
              sStack_cc = (short)((ulong)vSaturationCheckMin[0] >> 0x20);
              sStack_ca = (short)((ulong)vSaturationCheckMin[0] >> 0x30);
              sStack_e6 = vE[1]._2_2_;
              sStack_e4 = vE[1]._4_2_;
              sStack_e2 = vE[1]._6_2_;
              sStack_e0 = (short)vE[2];
              sStack_de = vE[2]._2_2_;
              sStack_dc = vE[2]._4_2_;
              sStack_da = vE[2]._6_2_;
              vSaturationCheckMax[1] =
                   CONCAT26((ushort)(sStack_e2 < sStack_d2) * sStack_e2 |
                            (ushort)(sStack_e2 >= sStack_d2) * sStack_d2,
                            CONCAT24((ushort)(sStack_e4 < sStack_d4) * sStack_e4 |
                                     (ushort)(sStack_e4 >= sStack_d4) * sStack_d4,
                                     CONCAT22((ushort)(sStack_e6 < sStack_d6) * sStack_e6 |
                                              (ushort)(sStack_e6 >= sStack_d6) * sStack_d6,
                                              (ushort)((short)vE[1] < local_d8) * (short)vE[1] |
                                              (ushort)((short)vE[1] >= local_d8) * local_d8)));
              vSaturationCheckMin[0] =
                   CONCAT26((ushort)(sStack_da < sStack_ca) * sStack_da |
                            (ushort)(sStack_da >= sStack_ca) * sStack_ca,
                            CONCAT24((ushort)(sStack_dc < sStack_cc) * sStack_dc |
                                     (ushort)(sStack_dc >= sStack_cc) * sStack_cc,
                                     CONCAT22((ushort)(sStack_de < sStack_ce) * sStack_de |
                                              (ushort)(sStack_de >= sStack_ce) * sStack_ce,
                                              (ushort)(sStack_e0 < sStack_d0) * sStack_e0 |
                                              (ushort)(sStack_e0 >= sStack_d0) * sStack_d0)));
              local_2f8 = (short)vNegInf[1];
              sStack_2f6 = (short)((ulong)vNegInf[1] >> 0x10);
              sStack_2f4 = (short)((ulong)vNegInf[1] >> 0x20);
              sStack_2f2 = (short)((ulong)vNegInf[1] >> 0x30);
              sStack_2f0 = (short)vSaturationCheckMax[0];
              sStack_2ee = (short)((ulong)vSaturationCheckMax[0] >> 0x10);
              sStack_2ec = (short)((ulong)vSaturationCheckMax[0] >> 0x20);
              sStack_2ea = (short)((ulong)vSaturationCheckMax[0] >> 0x30);
              vNegInf[1] = CONCAT26((ushort)(sStack_2f2 < sStack_e2) * sStack_e2 |
                                    (ushort)(sStack_2f2 >= sStack_e2) * sStack_2f2,
                                    CONCAT24((ushort)(sStack_2f4 < sStack_e4) * sStack_e4 |
                                             (ushort)(sStack_2f4 >= sStack_e4) * sStack_2f4,
                                             CONCAT22((ushort)(sStack_2f6 < sStack_e6) * sStack_e6 |
                                                      (ushort)(sStack_2f6 >= sStack_e6) * sStack_2f6
                                                      ,(ushort)(local_2f8 < (short)vE[1]) *
                                                       (short)vE[1] |
                                                       (ushort)(local_2f8 >= (short)vE[1]) *
                                                       local_2f8)));
              vSaturationCheckMax[0] =
                   CONCAT26((ushort)(sStack_2ea < sStack_da) * sStack_da |
                            (ushort)(sStack_2ea >= sStack_da) * sStack_2ea,
                            CONCAT24((ushort)(sStack_2ec < sStack_dc) * sStack_dc |
                                     (ushort)(sStack_2ec >= sStack_dc) * sStack_2ec,
                                     CONCAT22((ushort)(sStack_2ee < sStack_de) * sStack_de |
                                              (ushort)(sStack_2ee >= sStack_de) * sStack_2ee,
                                              (ushort)(sStack_2f0 < sStack_e0) * sStack_e0 |
                                              (ushort)(sStack_2f0 >= sStack_e0) * sStack_2f0)));
            }
            vWH_00[0] = (ulong)(uint)end_query;
            vWH_00[1]._0_4_ = local_8b0;
            vWH_00[1]._4_4_ = 0;
            arr_store_si128(((((parasail_result_t *)_s1_local)->field_4).rowcols)->score_row,vWH_00,
                            end_ref,s2Len,j_00,(int32_t)piVar46);
            ptr_00[(long)(end_ref + -7) + 7] = (short)vE[1];
            ptr_01[(long)(end_ref + -7) + 7] = (int16_t)vJ[1];
            local_1d8 = (short)vJreset[1];
            sStack_1d6 = vJreset[1]._2_2_;
            sStack_1d4 = vJreset[1]._4_2_;
            sStack_1d2 = vJreset[1]._6_2_;
            sStack_1d0 = (short)vJreset[2];
            sStack_1ce = vJreset[2]._2_2_;
            sStack_1cc = vJreset[2]._4_2_;
            sStack_1ca = vJreset[2]._6_2_;
            local_1e8 = auVar49._0_2_;
            sStack_1e6 = auVar49._2_2_;
            sStack_1e4 = auVar49._4_2_;
            sStack_1e2 = auVar49._6_2_;
            sStack_1e0 = auVar49._8_2_;
            sStack_1de = auVar49._10_2_;
            sStack_1dc = auVar49._12_2_;
            sStack_1da = auVar49._14_2_;
            local_208 = auVar50._0_2_;
            sStack_206 = auVar50._2_2_;
            sStack_204 = auVar50._4_2_;
            sStack_202 = auVar50._6_2_;
            sStack_200 = auVar50._8_2_;
            sStack_1fe = auVar50._10_2_;
            sStack_1fc = auVar50._12_2_;
            sStack_1fa = auVar50._14_2_;
            auVar33._8_8_ =
                 CONCAT26(-(ushort)(sStack_1ca == sStack_1da),
                          CONCAT24(-(ushort)(sStack_1cc == sStack_1dc),
                                   CONCAT22(-(ushort)(sStack_1ce == sStack_1de),
                                            -(ushort)(sStack_1d0 == sStack_1e0)))) &
                 CONCAT26(-(ushort)(sStack_1aa == sStack_1fa),
                          CONCAT24(-(ushort)(sStack_1ac == sStack_1fc),
                                   CONCAT22(-(ushort)(sStack_1ae == sStack_1fe),
                                            -(ushort)(sStack_1b0 == sStack_200))));
            auVar33._0_8_ =
                 CONCAT26(-(ushort)(sStack_1d2 == sStack_1e2),
                          CONCAT24(-(ushort)(sStack_1d4 == sStack_1e4),
                                   CONCAT22(-(ushort)(sStack_1d6 == sStack_1e6),
                                            -(ushort)(local_1d8 == local_1e8)))) &
                 CONCAT26(-(ushort)(sStack_1b2 == sStack_202),
                          CONCAT24(-(ushort)(sStack_1b4 == sStack_204),
                                   CONCAT22(-(ushort)(sStack_1b6 == sStack_206),
                                            -(ushort)(local_1b8 == local_208))));
            register0x00001240 = pblendvb(stack0xfffffffffffff898,register0x00001240,auVar33);
            auVar31._8_8_ = 0x1000100010001;
            auVar31._0_8_ = 0x1000100010001;
            _matrow0 = paddsw(_matrow0,auVar31);
            unique0x100031f5 = auVar30;
          }
          auVar30._8_8_ = 0x8000800080008;
          auVar30._0_8_ = 0x8000800080008;
          register0x00001200 = paddsw(stack0xfffffffffffff8b8,auVar30);
          register0x00001200 = psubsw(stack0xfffffffffffff848,auVar23);
        }
        local_67e = sVar43;
        for (end_query = 0; end_query < 8; end_query = end_query + 1) {
          if (local_67e < vMax[0]._6_2_) {
            local_67e = vMax[0]._6_2_;
          }
          vMax[0] = vMax[0] << 0x10 | (ulong)vILimit[1] >> 0x30;
          vILimit[1] = vILimit[1] << 0x10;
        }
        local_58 = (short)vSaturationCheckMax[1];
        sStack_56 = (short)((ulong)vSaturationCheckMax[1] >> 0x10);
        sStack_54 = (short)((ulong)vSaturationCheckMax[1] >> 0x20);
        sStack_52 = (short)((ulong)vSaturationCheckMax[1] >> 0x30);
        sStack_50 = (short)vSaturationCheckMin[0];
        sStack_4e = (short)((ulong)vSaturationCheckMin[0] >> 0x10);
        sStack_4c = (short)((ulong)vSaturationCheckMin[0] >> 0x20);
        sStack_4a = (short)((ulong)vSaturationCheckMin[0] >> 0x30);
        local_28 = (short)vNegInf[1];
        sStack_26 = (short)((ulong)vNegInf[1] >> 0x10);
        sStack_24 = (short)((ulong)vNegInf[1] >> 0x20);
        sStack_22 = (short)((ulong)vNegInf[1] >> 0x30);
        sStack_20 = (short)vSaturationCheckMax[0];
        sStack_1e = (short)((ulong)vSaturationCheckMax[0] >> 0x10);
        sStack_1c = (short)((ulong)vSaturationCheckMax[0] >> 0x20);
        sStack_1a = (short)((ulong)vSaturationCheckMax[0] >> 0x30);
        uVar64 = CONCAT26(-(ushort)(sStack_4a < sVar43),
                          CONCAT24(-(ushort)(sStack_4c < sVar43),
                                   CONCAT22(-(ushort)(sStack_4e < sVar43),
                                            -(ushort)(sStack_50 < sVar43)))) |
                 CONCAT26(-(ushort)(sVar44 < sStack_1a),
                          CONCAT24(-(ushort)(sVar44 < sStack_1c),
                                   CONCAT22(-(ushort)(sVar44 < sStack_1e),
                                            -(ushort)(sVar44 < sStack_20))));
        auVar42._8_8_ = uVar64;
        auVar42._0_8_ =
             CONCAT26(-(ushort)(sStack_52 < sVar43),
                      CONCAT24(-(ushort)(sStack_54 < sVar43),
                               CONCAT22(-(ushort)(sStack_56 < sVar43),-(ushort)(local_58 < sVar43)))
                     ) |
             CONCAT26(-(ushort)(sVar44 < sStack_22),
                      CONCAT24(-(ushort)(sVar44 < sStack_24),
                               CONCAT22(-(ushort)(sVar44 < sStack_26),-(ushort)(sVar44 < local_28)))
                     );
        if ((((((((((((((((auVar42 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar42 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar42 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar42 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar42 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar42 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar42 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar42 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (uVar64 >> 7 & 1) != 0) || (uVar64 >> 0xf & 1) != 0) || (uVar64 >> 0x17 & 1) != 0)
               || (uVar64 >> 0x1f & 1) != 0) || (uVar64 >> 0x27 & 1) != 0) ||
             (uVar64 >> 0x2f & 1) != 0) || (uVar64 >> 0x37 & 1) != 0) || (long)uVar64 < 0) {
          ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x40;
          local_67e = 0;
          _POS_LIMIT = 0;
          iStack_678 = 0;
        }
        ((parasail_result_t *)_s1_local)->score = (int)local_67e;
        ((parasail_result_t *)_s1_local)->end_query = _POS_LIMIT;
        ((parasail_result_t *)_s1_local)->end_ref = iStack_678;
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        if (matrix->type == 0) {
          parasail_free(s2B);
        }
      }
    }
  }
  return (parasail_result_t *)_s1_local;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int16_t * restrict s1 = NULL;
    int16_t * restrict s2B = NULL;
    int16_t * restrict _H_pr = NULL;
    int16_t * restrict _F_pr = NULL;
    int16_t * restrict s2 = NULL;
    int16_t * restrict H_pr = NULL;
    int16_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMax;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 8; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi16(NEG_LIMIT);
    vOpen = _mm_set1_epi16(open);
    vGap  = _mm_set1_epi16(gap);
    vOne = _mm_set1_epi16(1);
    vN = _mm_set1_epi16(N);
    vGapN = _mm_set1_epi16(gap*N);
    vNegOne = _mm_set1_epi16(-1);
    vI = _mm_set_epi16(0,1,2,3,4,5,6,7);
    vJreset = _mm_set_epi16(0,-1,-2,-3,-4,-5,-6,-7);
    vMax = vNegInf;
    vILimit = _mm_set1_epi16(s1Len);
    vILimit1 = _mm_subs_epi16(vILimit, vOne);
    vJLimit = _mm_set1_epi16(s2Len);
    vJLimit1 = _mm_subs_epi16(vJLimit, vOne);
    vIBoundary = _mm_set_epi16(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap,
            -open-4*gap,
            -open-5*gap,
            -open-6*gap,
            -open-7*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int16_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int16_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = -open - j*gap;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf;
        __m128i vWH = vNegInf;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        vNH = _mm_srli_si128(vNH, 2);
        vNH = _mm_insert_epi16(vNH, H_pr[-1], 7);
        vWH = _mm_srli_si128(vWH, 2);
        vWH = _mm_insert_epi16(vWH, -open - i*gap, 7);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 2);
            vNH = _mm_insert_epi16(vNH, H_pr[j], 7);
            vF = _mm_srli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, F_pr[j], 7);
            vF = _mm_max_epi16(
                    _mm_subs_epi16(vNH, vOpen),
                    _mm_subs_epi16(vF, vGap));
            vE = _mm_max_epi16(
                    _mm_subs_epi16(vWH, vOpen),
                    _mm_subs_epi16(vE, vGap));
            vMat = _mm_set_epi16(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]]
                    );
            vNWH = _mm_adds_epi16(vNWH, vMat);
            vWH = _mm_max_epi16(vNWH, vE);
            vWH = _mm_max_epi16(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi16(vJ,vNegOne);
                vWH = _mm_blendv_epi8(vWH, vIBoundary, cond);
                vF = _mm_blendv_epi8(vF, vNegInf, cond);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-7] = (int16_t)_mm_extract_epi16(vWH,0);
            F_pr[j-7] = (int16_t)_mm_extract_epi16(vF,0);
            /* as minor diagonal vector passes across table, extract
               last table value at the i,j bound */
            {
                __m128i cond_valid_I = _mm_cmpeq_epi16(vI, vILimit1);
                __m128i cond_valid_J = _mm_cmpeq_epi16(vJ, vJLimit1);
                __m128i cond_all = _mm_and_si128(cond_valid_I, cond_valid_J);
                vMax = _mm_blendv_epi8(vMax, vWH, cond_all);
            }
            vJ = _mm_adds_epi16(vJ, vOne);
        }
        vI = _mm_adds_epi16(vI, vN);
        vIBoundary = _mm_subs_epi16(vIBoundary, vGapN);
    }

    /* max in vMax */
    for (i=0; i<N; ++i) {
        int16_t value;
        value = (int16_t) _mm_extract_epi16(vMax, 7);
        if (value > score) {
            score = value;
        }
        vMax = _mm_slli_si128(vMax, 2);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}